

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O2

INode * __thiscall
COLLADASaxFWL::FormulasLoader::createFunctionOperation
          (FormulasLoader *this,NodeVector *nodes,Operator op)

{
  String *name;
  FunctionExpression *this_00;
  
  if (op - POW < 0x26) {
    name = (String *)(&PTR_FUNCTION_POW_abi_cxx11__0095edc8)[op - POW];
    this_00 = (FunctionExpression *)operator_new(0x40);
    MathML::AST::FunctionExpression::FunctionExpression(this_00,name);
    (*(this_00->super_INode)._vptr_INode[8])(this_00,nodes);
  }
  else {
    this_00 = (FunctionExpression *)0x0;
  }
  return &this_00->super_INode;
}

Assistant:

MathML::AST::INode* FormulasLoader::createFunctionOperation( const NodeVector& nodes, Operator op )
	{
		const MathML::String* functionName;
		switch ( op )
		{
		case POW:
			functionName = &MathML::FUNCTION_POW;
			break;
		case FACTORIAL:
			functionName = &MathML::FUNCTION_FACTORIAL;
			break;
		case ABS:
			functionName = &MathML::FUNCTION_ABS;
			break;
		case EXP:
			functionName = &MathML::FUNCTION_EXP;
			break;
		case LN:
			functionName = &MathML::FUNCTION_LOGN;
			break;
		case MIN:
			functionName = &MathML::FUNCTION_MIN;
			break;
		case MAX:
			functionName = &MathML::FUNCTION_MAX;
			break;
		case CEIL:
			functionName = &MathML::FUNCTION_CEILING;
			break;
		case FLOOR:
			functionName = &MathML::FUNCTION_FLOOR;
			break;
		case GCD:
			functionName = &MathML::FUNCTION_GCD;
			break;
		case LCM:
			functionName = &MathML::FUNCTION_LCM;
			break;
		case REM:
			functionName = &MathML::FUNCTION_REM;
			break;
		case ROOT:
			functionName = &MathML::FUNCTION_ROOT;
			break;
		case LOG:
			functionName = &MathML::FUNCTION_LOG;
			break;
		case SIN:
			functionName = &MathML::FUNCTION_SIN;
			break;
		case COS:
			functionName = &MathML::FUNCTION_COS;
			break;
		case TAN:
			functionName = &MathML::FUNCTION_TAN;
			break;
		case SEC:
			functionName = &MathML::FUNCTION_SEC;
			break;
		case CSC:
			functionName = &MathML::FUNCTION_CSC;
			break;
		case COT:
			functionName = &MathML::FUNCTION_COT;
			break;
		case ARCSIN:
			functionName = &MathML::FUNCTION_ARCSIN;
			break;
		case ARCCOS:
			functionName = &MathML::FUNCTION_ARCCOS;
			break;
		case ARCTAN:
			functionName = &MathML::FUNCTION_ARCTAN;
			break;
		case ARCSEC:
			functionName = &MathML::FUNCTION_ARCSEC;
			break;
		case ARCCSC:
			functionName = &MathML::FUNCTION_ARCCSC;
			break;
		case ARCCOT:
			functionName = &MathML::FUNCTION_ARCCOT;
			break;
		case SINH:
			functionName = &MathML::FUNCTION_SINH;
			break;
		case COSH:
			functionName = &MathML::FUNCTION_COSH;
			break;
		case TANH:
			functionName = &MathML::FUNCTION_TANH;
			break;
		case SECH:
			functionName = &MathML::FUNCTION_SECH;
			break;
		case CSCH:
			functionName = &MathML::FUNCTION_CSCH;
			break;
		case COTH:
			functionName = &MathML::FUNCTION_COTH;
			break;
		case ARCSINH:
			functionName = &MathML::FUNCTION_ARCSINH;
			break;
		case ARCCOSH:
			functionName = &MathML::FUNCTION_ARCCOSH;
			break;
		case ARCTANH:
			functionName = &MathML::FUNCTION_ARCTANH;
			break;
		case ARCCOTH:
			functionName = &MathML::FUNCTION_ARCCOTH;
			break;
		case ARCSECH:
			functionName = &MathML::FUNCTION_ARCSECH;
			break;
		case ARCCSCH:
			functionName = &MathML::FUNCTION_ARCCSCH;
			break;
		default:
			// invalid operator
			return 0;
		}

		MathML::AST::FunctionExpression* expression = new MathML::AST::FunctionExpression( *functionName );
		expression->setParameterList( nodes );

		return expression;
	}